

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_deviate_default
              (lys_module *module,lys_deviate *deviate,lys_node *dev_target,ly_set *dflt_check)

{
  int iVar1;
  lys_node *plVar2;
  LY_ERR *pLVar3;
  char *pcVar4;
  char **dflt;
  lys_node_leaflist *llist;
  int i;
  ly_set *dflt_check_local;
  lys_node *dev_target_local;
  lys_deviate *deviate_local;
  lys_module *module_local;
  
  if ((((byte)module->field_0x40 >> 1 & 7) < 2) && (dev_target->nodetype == LYS_LEAFLIST)) {
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"default");
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"default\" property.");
  }
  else if ((deviate->dflt_size < 2) || (dev_target->nodetype == LYS_LEAFLIST)) {
    if ((dev_target->nodetype & (LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE)) == LYS_UNKNOWN) {
      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"default");
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"default\" property.");
    }
    else {
      if (deviate->mod == LY_DEVIATE_ADD) {
        if (((dev_target->nodetype == LYS_LEAF) && (dev_target[1].prev != (lys_node *)0x0)) ||
           ((dev_target->nodetype == LYS_CHOICE && (dev_target[1].dsc != (char *)0x0)))) {
          ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"default");
          ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Adding property that already exists.");
          return 1;
        }
        if (((dev_target->flags & 0x40) != 0) ||
           ((dev_target->nodetype == LYS_LEAFLIST && (*(int *)&dev_target[1].priv != 0)))) {
          ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"default","deviation");
          pcVar4 = "leaflists with non-zero \"min-elements\"";
          if ((dev_target->flags & 0x40) != 0) {
            pcVar4 = "nodes with the \"mandatory\"";
          }
          ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                  "Adding the \"default\" statement is forbidden on %s statement.",pcVar4);
          return 1;
        }
      }
      else if ((deviate->mod == LY_DEVIATE_RPL) &&
              ((((dev_target->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN &&
                (dev_target[1].prev == (lys_node *)0x0)) ||
               ((dev_target->nodetype == LYS_CHOICE && (dev_target[1].dsc == (char *)0x0)))))) {
        ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"default");
        ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Replacing a property that does not exist.");
        return 1;
      }
      if (dev_target->nodetype == LYS_LEAFLIST) {
        if (deviate->mod == LY_DEVIATE_ADD) {
          plVar2 = (lys_node *)
                   realloc(dev_target[1].prev,
                           (long)(int)((uint)deviate->dflt_size + (uint)dev_target->padding[2]) << 3
                          );
          if (plVar2 == (lys_node *)0x0) {
            pLVar3 = ly_errno_location();
            *pLVar3 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_deviate_default");
            return 1;
          }
          dev_target[1].prev = plVar2;
        }
        else if (deviate->mod == LY_DEVIATE_RPL) {
          for (llist._4_4_ = 0; llist._4_4_ < (int)(uint)dev_target->padding[2];
              llist._4_4_ = llist._4_4_ + 1) {
            lydict_remove(dev_target->module->ctx,
                          *(char **)((dev_target[1].prev)->padding + (long)llist._4_4_ * 8 + -0x1c))
            ;
          }
          plVar2 = (lys_node *)realloc(dev_target[1].prev,(ulong)deviate->dflt_size << 3);
          if (plVar2 == (lys_node *)0x0) {
            pLVar3 = ly_errno_location();
            *pLVar3 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_deviate_default");
            return 1;
          }
          dev_target[1].prev = plVar2;
          dev_target->padding[2] = '\0';
        }
      }
      llist._4_4_ = 0;
      while( true ) {
        if ((int)(uint)deviate->dflt_size <= llist._4_4_) {
          return 0;
        }
        iVar1 = yang_fill_deviate_default
                          (module->ctx,deviate,dev_target,dflt_check,deviate->dflt[llist._4_4_]);
        if (iVar1 != 0) break;
        llist._4_4_ = llist._4_4_ + 1;
      }
    }
  }
  else {
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"default");
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "Target node does not allow multiple \"default\" properties.");
  }
  return 1;
}

Assistant:

int
yang_read_deviate_default(struct lys_module *module, struct lys_deviate *deviate,
                          struct lys_node *dev_target, struct ly_set * dflt_check)
{
    int i;
    struct lys_node_leaflist *llist;
    const char **dflt;

    /* check target node type */
    if (module->version < 2 && dev_target->nodetype == LYS_LEAFLIST) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"default\" property.");
        goto error;
    } else if (deviate->dflt_size > 1 && dev_target->nodetype != LYS_LEAFLIST) { /* from YANG 1.1 */
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow multiple \"default\" properties.");
        goto error;
    } else if (!(dev_target->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_CHOICE))) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"default\" property.");
        goto error;
    }

    if (deviate->mod == LY_DEVIATE_ADD) {
        /* check that there is no current value */
        if ((dev_target->nodetype == LYS_LEAF && ((struct lys_node_leaf *)dev_target)->dflt) ||
                (dev_target->nodetype == LYS_CHOICE && ((struct lys_node_choice *)dev_target)->dflt)) {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Adding property that already exists.");
            goto error;
        }

        /* check collision with mandatory/min-elements */
        if ((dev_target->flags & LYS_MAND_TRUE) ||
                (dev_target->nodetype == LYS_LEAFLIST && ((struct lys_node_leaflist *)dev_target)->min)) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "default", "deviation");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL,
                   "Adding the \"default\" statement is forbidden on %s statement.",
                   (dev_target->flags & LYS_MAND_TRUE) ? "nodes with the \"mandatory\"" : "leaflists with non-zero \"min-elements\"");
            goto error;
        }
    } else if (deviate->mod == LY_DEVIATE_RPL) {
        /* check that there was a value before */
        if (((dev_target->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && !((struct lys_node_leaf *)dev_target)->dflt) ||
                (dev_target->nodetype == LYS_CHOICE && !((struct lys_node_choice *)dev_target)->dflt)) {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Replacing a property that does not exist.");
            goto error;
        }
    }

    if (dev_target->nodetype == LYS_LEAFLIST) {
        /* reallocate default list in the target */
        llist = (struct lys_node_leaflist *)dev_target;
        if (deviate->mod == LY_DEVIATE_ADD) {
            /* reallocate (enlarge) the unique array of the target */
            dflt = realloc(llist->dflt, (deviate->dflt_size + llist->dflt_size) * sizeof *dflt);
            if (!dflt) {
                LOGMEM;
                goto error;
            }
            llist->dflt = dflt;
        } else if (deviate->mod == LY_DEVIATE_RPL) {
            /* reallocate (replace) the unique array of the target */
            for (i = 0; i < llist->dflt_size; i++) {
                lydict_remove(llist->module->ctx, llist->dflt[i]);
            }
            dflt = realloc(llist->dflt, deviate->dflt_size * sizeof *dflt);
            if (!dflt) {
                LOGMEM;
                goto error;
            }
            llist->dflt = dflt;
            llist->dflt_size = 0;
        }
    }

    for (i = 0; i < deviate->dflt_size; ++i) {
        if (yang_fill_deviate_default(module->ctx, deviate, dev_target, dflt_check, deviate->dflt[i])) {
            goto error;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}